

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O0

int find_by_flag(png_uint_32 flag)

{
  int local_10;
  int i;
  png_uint_32 flag_local;
  
  local_10 = 0x19;
  do {
    local_10 = local_10 + -1;
    if (local_10 < 0) {
      fprintf(_stderr,"pngunknown: internal error\n");
      exit(4);
    }
  } while (chunk_info[local_10].flag != flag);
  return local_10;
}

Assistant:

static int
find_by_flag(png_uint_32 flag)
{
   int i = NINFO;

   while (--i >= 0)
      if (chunk_info[i].flag == flag)
         return i;

   fprintf(stderr, "pngunknown: internal error\n");
   exit(4);
}